

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O2

void __thiscall
cmCPackNSISGenerator::CreateMenuLinks
          (cmCPackNSISGenerator *this,ostringstream *str,ostringstream *deleteStr)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  pointer pbVar6;
  allocator local_211;
  ostringstream *local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cpackMenuLinksVector;
  string linkName;
  string desktop;
  ostringstream cmCPackLog_msg;
  
  local_210 = deleteStr;
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_NSIS_MENU_LINKS",(allocator *)&linkName);
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar4 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"The cpackMenuLinks: ");
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5,".");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,599,linkName._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&linkName);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    cpackMenuLinksVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cpackMenuLinksVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cpackMenuLinksVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar4,(allocator *)&linkName);
    cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&cpackMenuLinksVector,false);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (((int)cpackMenuLinksVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
         (int)cpackMenuLinksVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x20U) == 0) {
      if (CreateMenuLinks(std::__cxx11::ostringstream&,std::__cxx11::ostringstream&)::urlRegex ==
          '\0') {
        iVar3 = __cxa_guard_acquire(&CreateMenuLinks(std::__cxx11::ostringstream&,std::__cxx11::ostringstream&)
                                     ::urlRegex);
        if (iVar3 != 0) {
          cmsys::RegularExpression::RegularExpression
                    (&CreateMenuLinks::urlRegex,"^(mailto:|(ftps?|https?|news)://).*$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&CreateMenuLinks::urlRegex,
                       &__dso_handle);
          __cxa_guard_release(&CreateMenuLinks(std::__cxx11::ostringstream&,std::__cxx11::ostringstream&)
                               ::urlRegex);
        }
      }
      for (pbVar6 = cpackMenuLinksVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 != cpackMenuLinksVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 2) {
        std::__cxx11::string::string((string *)&cmCPackLog_msg,(string *)pbVar6);
        bVar2 = cmsys::RegularExpression::find(&CreateMenuLinks::urlRegex,_cmCPackLog_msg);
        if (!bVar2) {
          cmsys::SystemTools::ReplaceString((string *)&cmCPackLog_msg,"/","\\");
        }
        std::__cxx11::string::string((string *)&linkName,(string *)(pbVar6 + 1));
        if (bVar2) {
          poVar5 = std::operator<<((ostream *)str,"  WriteINIStr \"$SMPROGRAMS\\$STARTMENU_FOLDER\\"
                                  );
          poVar5 = std::operator<<(poVar5,(string *)&linkName);
          poVar5 = std::operator<<(poVar5,".url\" \"InternetShortcut\" \"URL\" \"");
          poVar5 = std::operator<<(poVar5,(string *)&cmCPackLog_msg);
          poVar5 = std::operator<<(poVar5,"\"");
          std::endl<char,std::char_traits<char>>(poVar5);
          poVar5 = std::operator<<((ostream *)local_210,"  Delete \"$SMPROGRAMS\\$MUI_TEMP\\");
          poVar5 = std::operator<<(poVar5,(string *)&linkName);
          pcVar4 = ".url\"";
        }
        else {
          poVar5 = std::operator<<((ostream *)str,
                                   "  CreateShortCut \"$SMPROGRAMS\\$STARTMENU_FOLDER\\");
          poVar5 = std::operator<<(poVar5,(string *)&linkName);
          poVar5 = std::operator<<(poVar5,".lnk\" \"$INSTDIR\\");
          poVar5 = std::operator<<(poVar5,(string *)&cmCPackLog_msg);
          poVar5 = std::operator<<(poVar5,"\"");
          std::endl<char,std::char_traits<char>>(poVar5);
          poVar5 = std::operator<<((ostream *)local_210,"  Delete \"$SMPROGRAMS\\$MUI_TEMP\\");
          poVar5 = std::operator<<(poVar5,(string *)&linkName);
          pcVar4 = ".lnk\"";
        }
        poVar5 = std::operator<<(poVar5,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::string((string *)&desktop,"CPACK_CREATE_DESKTOP_LINK_",&local_211);
        std::__cxx11::string::append((string *)&desktop);
        bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&desktop);
        if (bVar2) {
          std::operator<<((ostream *)str,"  StrCmp \"$INSTALL_DESKTOP\" \"1\" 0 +2\n");
          poVar5 = std::operator<<((ostream *)str,"    CreateShortCut \"$DESKTOP\\");
          poVar5 = std::operator<<(poVar5,(string *)&linkName);
          poVar5 = std::operator<<(poVar5,".lnk\" \"$INSTDIR\\");
          poVar5 = std::operator<<(poVar5,(string *)&cmCPackLog_msg);
          poVar5 = std::operator<<(poVar5,"\"");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::operator<<((ostream *)local_210,"  StrCmp \"$INSTALL_DESKTOP\" \"1\" 0 +2\n");
          poVar5 = std::operator<<((ostream *)local_210,"    Delete \"$DESKTOP\\");
          poVar5 = std::operator<<(poVar5,(string *)&linkName);
          poVar5 = std::operator<<(poVar5,".lnk\"");
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        std::__cxx11::string::~string((string *)&desktop);
        std::__cxx11::string::~string((string *)&linkName);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,
                               "CPACK_NSIS_MENU_LINKS should contain pairs of <shortcut target> and <shortcut label>."
                              );
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0x260,linkName._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&linkName);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cpackMenuLinksVector);
  }
  return;
}

Assistant:

void cmCPackNSISGenerator::CreateMenuLinks( std::ostringstream& str,
                                            std::ostringstream& deleteStr)
{
  const char* cpackMenuLinks
    = this->GetOption("CPACK_NSIS_MENU_LINKS");
  if(!cpackMenuLinks)
    {
    return;
    }
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "The cpackMenuLinks: "
                << cpackMenuLinks << "." << std::endl);
  std::vector<std::string> cpackMenuLinksVector;
  cmSystemTools::ExpandListArgument(cpackMenuLinks,
                                    cpackMenuLinksVector);
  if ( cpackMenuLinksVector.size() % 2 != 0 )
    {
    cmCPackLogger(
      cmCPackLog::LOG_ERROR,
      "CPACK_NSIS_MENU_LINKS should contain pairs of <shortcut target> and "
      "<shortcut label>." << std::endl);
    return;
    }

  static cmsys::RegularExpression
    urlRegex("^(mailto:|(ftps?|https?|news)://).*$");

  std::vector<std::string>::iterator it;
  for ( it = cpackMenuLinksVector.begin();
        it != cpackMenuLinksVector.end();
        ++it )
    {
    std::string sourceName = *it;
    const bool url = urlRegex.find(sourceName);

    // Convert / to \ in filenames, but not in urls:
    //
    if(!url)
      {
      cmSystemTools::ReplaceString(sourceName, "/", "\\");
      }

    ++ it;
    std::string linkName = *it;
    if(!url)
      {
      str << "  CreateShortCut \"$SMPROGRAMS\\$STARTMENU_FOLDER\\"
          << linkName << ".lnk\" \"$INSTDIR\\" << sourceName << "\""
          << std::endl;
      deleteStr << "  Delete \"$SMPROGRAMS\\$MUI_TEMP\\" << linkName
                << ".lnk\"" << std::endl;
      }
    else
      {
      str << "  WriteINIStr \"$SMPROGRAMS\\$STARTMENU_FOLDER\\"
          << linkName << ".url\" \"InternetShortcut\" \"URL\" \""
          << sourceName << "\""
          << std::endl;
      deleteStr << "  Delete \"$SMPROGRAMS\\$MUI_TEMP\\" << linkName
                << ".url\"" << std::endl;
      }
    // see if CPACK_CREATE_DESKTOP_LINK_ExeName is on
    // if so add a desktop link
    std::string desktop = "CPACK_CREATE_DESKTOP_LINK_";
    desktop += linkName;
    if(this->IsSet(desktop))
      {
      str << "  StrCmp \"$INSTALL_DESKTOP\" \"1\" 0 +2\n";
      str << "    CreateShortCut \"$DESKTOP\\"
          << linkName << ".lnk\" \"$INSTDIR\\" << sourceName << "\""
          << std::endl;
      deleteStr << "  StrCmp \"$INSTALL_DESKTOP\" \"1\" 0 +2\n";
      deleteStr << "    Delete \"$DESKTOP\\" << linkName
                << ".lnk\"" << std::endl;
      }
    }
}